

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O0

void __thiscall Buffer::resize(Buffer *this,usize size)

{
  Memory *this_00;
  byte *newBuffer;
  usize size_local;
  Buffer *this_local;
  
  if (this->_capacity < size) {
    this->_capacity = size;
    this_00 = (Memory *)operator_new__(size + 1);
    Memory::copy(this_00,(EVP_PKEY_CTX *)this->bufferStart,
                 (EVP_PKEY_CTX *)(this->bufferEnd + -(long)this->bufferStart));
    if (this->buffer != (byte *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = (byte *)this_00;
    this->bufferStart = (byte *)this_00;
    this->bufferEnd = (byte *)(this_00 + size);
    *this->bufferEnd = '\0';
  }
  else if (this->buffer != (byte *)0x0) {
    if (this->buffer + this->_capacity < this->bufferStart + size) {
      Memory::move(this->buffer,this->bufferStart,(long)this->bufferEnd - (long)this->bufferStart);
      this->bufferStart = this->buffer;
      this->bufferEnd = this->buffer + size;
      *this->bufferEnd = '\0';
    }
    else {
      this->bufferEnd = this->bufferStart + size;
      *this->bufferEnd = '\0';
    }
  }
  return;
}

Assistant:

void resize(usize size)
  {
    if(size > _capacity)
    {
        _capacity = size;
      byte* newBuffer = (byte*)new char[size + 1];
      Memory::copy(newBuffer, bufferStart, bufferEnd - bufferStart);
      delete[] (char*)buffer;
      bufferStart = buffer = newBuffer;
      bufferEnd = newBuffer + size;
      *bufferEnd = 0;
    }
    else if(buffer)
    {
      if(bufferStart + size <= buffer + _capacity)
      {
        bufferEnd = bufferStart + size;
        *bufferEnd = 0;
      }
      else
      {
        Memory::move(buffer, bufferStart, bufferEnd - bufferStart);
        bufferStart = buffer;
        bufferEnd = buffer + size;
        *bufferEnd = 0;
      }
    }
  }